

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferTextureBufferRange::deinit(TextureBufferTextureBufferRange *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported == true) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar2 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar2 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
    (**(code **)(lVar2 + 0xd8))(0);
    if (this->m_tbo_id != 0) {
      (**(code **)(lVar2 + 0x438))(1,&this->m_tbo_id);
      this->m_tbo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    }
    cleanIteration(this);
    return;
  }
  return;
}

Assistant:

void TextureBufferTextureBufferRange::deinit(void)
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	/* Check if texture buffer extension is supported */
	if (!m_is_texture_buffer_supported)
	{
		return;
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);
	gl.bindVertexArray(0);

	/* Delete GLES objects */
	if (0 != m_tbo_id)
	{
		gl.deleteBuffers(1, &m_tbo_id);
		m_tbo_id = 0;
	}

	if (0 != m_vao_id)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
	}

	cleanIteration();
}